

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int re2::MaxRune(int len)

{
  undefined1 local_10;
  int b;
  int len_local;
  
  if (len == 1) {
    local_10 = 7;
  }
  else {
    local_10 = (char)len * '\x05' + 1;
  }
  return (1 << (local_10 & 0x1f)) + -1;
}

Assistant:

static int MaxRune(int len) {
  int b;  // number of Rune bits in len-byte UTF-8 sequence (len < UTFmax)
  if (len == 1)
    b = 7;
  else
    b = 8-(len+1) + 6*(len-1);
  return (1<<b) - 1;   // maximum Rune for b bits.
}